

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformations.c
# Opt level: O0

void al_rotate_transform(ALLEGRO_TRANSFORM *trans,float theta)

{
  float fVar1;
  float *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  float fVar3;
  float t;
  float s;
  float c;
  
  fVar2 = cosf(in_XMM0_Da);
  fVar3 = sinf(in_XMM0_Da);
  fVar1 = *in_RDI;
  *in_RDI = fVar1 * fVar2 + -(in_RDI[1] * fVar3);
  in_RDI[1] = fVar1 * fVar3 + in_RDI[1] * fVar2;
  fVar1 = in_RDI[4];
  in_RDI[4] = fVar1 * fVar2 + -(in_RDI[5] * fVar3);
  in_RDI[5] = fVar1 * fVar3 + in_RDI[5] * fVar2;
  fVar1 = in_RDI[0xc];
  in_RDI[0xc] = fVar1 * fVar2 + -(in_RDI[0xd] * fVar3);
  in_RDI[0xd] = fVar1 * fVar3 + in_RDI[0xd] * fVar2;
  return;
}

Assistant:

void al_rotate_transform(ALLEGRO_TRANSFORM *trans, float theta)
{
   float c, s;
   float t;
   ASSERT(trans);

   c = cosf(theta);
   s = sinf(theta);

   t = trans->m[0][0];
   trans->m[0][0] = t * c - trans->m[0][1] * s;
   trans->m[0][1] = t * s + trans->m[0][1] * c;

   t = trans->m[1][0];
   trans->m[1][0] = t * c - trans->m[1][1] * s;
   trans->m[1][1] = t * s + trans->m[1][1] * c;

   t = trans->m[3][0];
   trans->m[3][0] = t * c - trans->m[3][1] * s;
   trans->m[3][1] = t * s + trans->m[3][1] * c;
}